

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

void __thiscall Imf_3_4::TimeCode::setMinutes(TimeCode *this,int value)

{
  uint field;
  ArgExc *this_00;
  int in_ESI;
  uint *in_RDI;
  
  if ((-1 < in_ESI) && (in_ESI < 0x3c)) {
    field = anon_unknown_1::binaryToBcd(in_ESI);
    anon_unknown_1::setBitField(in_RDI,0x10,0x16,field);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc
            (this_00,"Cannot set minutes field in time code. New value is out of range.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setMinutes (int value)
{
    if (value < 0 || value > 59)
        throw IEX_NAMESPACE::ArgExc ("Cannot set minutes field in time code. "
                                     "New value is out of range.");

    setBitField (_time, 16, 22, binaryToBcd (value));
}